

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  thread count_thread2;
  thread count_thread1;
  thread local_18;
  thread local_10;
  
  std::thread::thread<void(&)(),,void>(&local_10,count);
  std::thread::thread<void(&)(),,void>(&local_18,count);
  std::thread::join();
  std::thread::join();
  if ((local_18._M_id._M_thread == 0) && (local_10._M_id._M_thread == 0)) {
    return 0;
  }
  std::terminate();
}

Assistant:

int main() {
//  std::thread test_thread(test);
//  test_thread.join();

  std::thread count_thread1(count), count_thread2(count);
  count_thread1.join();
  count_thread2.join();
//  test();
//  ins::LLogMessage("a.txt", "aaa", 1, 1) << "Aaa";
  return 0;
}